

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O3

void build_move16(m68k_info *info,int *data,int *modes)

{
  cs_m68k_op *pcVar1;
  int iVar2;
  m68k_address_mode mVar3;
  bool bVar4;
  bool bVar5;
  long lVar6;
  
  MCInst_setOpcode(info->inst,0x120);
  (info->extension).op_count = '\x02';
  (info->extension).op_size.type = M68K_SIZE_TYPE_CPU;
  (info->extension).op_size.field_1 = (anon_union_4_2_f1e43d3e_for_m68k_op_size_1)0x0;
  lVar6 = 0;
  bVar4 = true;
  do {
    bVar5 = bVar4;
    pcVar1 = (info->extension).operands + lVar6;
    iVar2 = data[lVar6];
    mVar3 = modes[lVar6];
    (info->extension).operands[lVar6].type = M68K_OP_MEM;
    if ((mVar3 == M68K_AM_REGI_ADDR_POST_INC) || (mVar3 == M68K_AM_REG_DIRECT_ADDR)) {
      pcVar1->address_mode = mVar3;
      (pcVar1->field_0).reg = iVar2 + M68K_REG_A0;
    }
    else {
      pcVar1->address_mode = mVar3;
      pcVar1->field_0 = (anon_union_8_5_85a7a27f_for_cs_m68k_op_0)(long)iVar2;
    }
    lVar6 = 1;
    bVar4 = false;
  } while (bVar5);
  return;
}

Assistant:

static void build_move16(m68k_info *info, int data[2], int modes[2])
{
	cs_m68k* ext = build_init_op(info, M68K_INS_MOVE16, 2, 0);
	int i;

	for (i = 0; i < 2; ++i) {
		cs_m68k_op* op = &ext->operands[i];
		const int d = data[i];
		const int m = modes[i];

		op->type = M68K_OP_MEM;

		if (m == M68K_AM_REGI_ADDR_POST_INC || m == M68K_AM_REG_DIRECT_ADDR) {
			op->address_mode = m;
			op->reg = M68K_REG_A0 + d;
		} else {
			op->address_mode = m;
			op->imm = d;
		}
	}
}